

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::LayeredRenderCase::iterate(LayeredRenderCase *this)

{
  ArrayBuffer<unsigned_int,_4UL,_4UL> *pAVar1;
  TestLog *pTVar2;
  bool bVar3;
  bool bVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar6;
  undefined1 logging;
  string *description;
  Surface *pSVar7;
  uint *puVar8;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  Vec4 *barColor;
  char *description_00;
  IterateResult IVar9;
  int iVar10;
  TestContext *this_00;
  int iVar11;
  float rowWidthRatio;
  ulong uVar12;
  allocator<char> local_396;
  allocator<char> local_395;
  allocator<char> local_394;
  allocator<char> local_393;
  allocator<char> local_392;
  allocator<char> local_391;
  uint *local_390;
  ScopedLogSection section_1;
  Surface layer1;
  Surface layer_1;
  Surface layer0;
  ScopedLogSection section;
  string local_2e8;
  Vec4 colors [6];
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  Surface layer;
  undefined4 extraout_var_01;
  
  iVar11 = this->m_iteration;
  this->m_iteration = iVar11 + 1;
  if (iVar11 == 0) {
    if (this->m_test != TEST_LAYER_PROVOKING_VERTEX) {
LAB_003f6a7a:
      pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&layer,"RenderToTexture",(allocator<char> *)&layer_1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)colors,"Render to layered texture",(allocator<char> *)&local_2e8);
      tcu::ScopedLogSection::ScopedLogSection(&section_1,pTVar2,(string *)&layer,(string *)colors);
      std::__cxx11::string::~string((string *)colors);
      std::__cxx11::string::~string((string *)&layer);
      getTargetDimensions((LayeredRenderCase *)&layer_1,this->m_target);
      iVar11 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
      lVar6 = CONCAT44(extraout_var_01,iVar11);
      glu::TypedObjectWrapper<(glu::ObjectType)5>::TypedObjectWrapper
                ((TypedObjectWrapper<(glu::ObjectType)5> *)colors,
                 ((this->super_TestCase).m_context)->m_renderCtx);
      layer._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      pAVar1 = &layer.m_pixels;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)pAVar1);
      std::operator<<((ostream *)pAVar1,"Rendering to texture");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&layer,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)pAVar1);
      (**(code **)(lVar6 + 0x78))(0x8d40,this->m_fbo);
      (**(code **)(lVar6 + 0x1c0))(0);
      (**(code **)(lVar6 + 0x188))(0x4000);
      (**(code **)(lVar6 + 0x1a00))(0,0,layer_1.m_width,layer_1.m_height);
      (**(code **)(lVar6 + 0x188))(0x4000);
      (**(code **)(lVar6 + 0xd8))(colors[1].m_data[0]);
      (**(code **)(lVar6 + 0x1680))((this->m_renderShader->m_program).m_program);
      (**(code **)(lVar6 + 0x538))(0,0,1);
      (**(code **)(lVar6 + 0x1680))(0);
      (**(code **)(lVar6 + 0xd8))(0);
      (**(code **)(lVar6 + 0x78))(0x8d40,0);
      dVar5 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar5,"render",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                      ,0xd35);
      glu::ObjectWrapper::~ObjectWrapper((ObjectWrapper *)colors);
      tcu::ScopedLogSection::~ScopedLogSection(&section_1);
      return CONTINUE;
    }
    gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
              ((StateQueryMemoryWriteGuard<int> *)&layer_1);
    iVar11 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar11) + 0x868))(0x825e,&layer_1.m_height);
    iVar11 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    dVar5 = (**(code **)(CONCAT44(extraout_var_00,iVar11) + 0x800))();
    glu::checkError(dVar5,"getInteger(GL_LAYER_PROVOKING_VERTEX)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                    ,0xb11);
    bVar3 = gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                      ((StateQueryMemoryWriteGuard<int> *)&layer_1,
                       (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    if (bVar3) {
      layer._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      pAVar1 = &layer.m_pixels;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)pAVar1);
      std::operator<<((ostream *)pAVar1,"GL_LAYER_PROVOKING_VERTEX = ");
      colors[0].m_data._0_8_ = glu::getProvokingVertexName;
      colors[0].m_data[2] = (float)layer_1.m_height;
      tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)colors,(ostream *)pAVar1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&layer,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)pAVar1);
      if ((layer_1.m_height - 0x8e4dU < 2) || (layer_1.m_height == 0x8260)) {
        this->m_provokingVertex = layer_1.m_height;
        goto LAB_003f6a7a;
      }
      layer._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      pAVar1 = &layer.m_pixels;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)pAVar1);
      std::operator<<((ostream *)pAVar1,
                      "getInteger(GL_LAYER_PROVOKING_VERTEX) returned illegal value. Got ");
      std::ostream::operator<<(pAVar1,layer_1.m_height);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&layer,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)pAVar1);
      this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      description_00 = "got unexpected provoking vertex value";
      goto LAB_003f70a4;
    }
    goto LAB_003f70ac;
  }
  if ((this->m_test == TEST_LAYER_PROVOKING_VERTEX) && (this->m_provokingVertex == 0x8260)) {
    pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&layer,"VerifyLayers",(allocator<char> *)&layer_1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)colors,"Verify layers 0 and 1",(allocator<char> *)&section_1);
    description = (string *)colors;
    tcu::ScopedLogSection::ScopedLogSection(&section,pTVar2,(string *)&layer,description);
    std::__cxx11::string::~string((string *)colors);
    std::__cxx11::string::~string((string *)&layer);
    tcu::Surface::Surface
              (&layer0,(this->m_resolveDimensions).m_data[0],(this->m_resolveDimensions).m_data[1]);
    tcu::Surface::Surface
              (&layer1,(this->m_resolveDimensions).m_data[0],(this->m_resolveDimensions).m_data[1]);
    sampleTextureLayer(this,&layer0,0);
    sampleTextureLayer(this,&layer1,1);
    bVar3 = verifyEmptyImage(this,&layer0,false);
    bVar4 = verifyEmptyImage(this,&layer1,false);
    layer._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    pAVar1 = &layer.m_pixels;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pAVar1);
    std::operator<<((ostream *)pAVar1,"Expecting non-empty layers, or non-empty layer.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&layer,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pAVar1);
    if (bVar3 && bVar4) {
      layer._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      pAVar1 = &layer.m_pixels;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)pAVar1);
      std::operator<<((ostream *)pAVar1,"Got empty images.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&layer,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)pAVar1);
    }
    pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&section_1,"LayerContent",&local_391);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e8,"Layer content",&local_392);
    tcu::LogImageSet::LogImageSet((LogImageSet *)&layer_1,(string *)&section_1,&local_2e8);
    iVar10 = (int)pTVar2;
    tcu::LogImageSet::write((LogImageSet *)&layer_1,iVar10,__buf,(size_t)description);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"Layer",&local_393);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"Layer0",&local_394);
    pSVar7 = &layer0;
    tcu::LogImage::LogImage
              ((LogImage *)&layer,&local_238,&local_1d8,pSVar7,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&layer,iVar10,__buf_00,(size_t)pSVar7);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"Layer",&local_395);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"Layer1",&local_396);
    pSVar7 = &layer1;
    iVar11 = 2;
    tcu::LogImage::LogImage
              ((LogImage *)colors,&local_1f8,&local_218,pSVar7,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)colors,iVar10,__buf_01,(size_t)pSVar7);
    tcu::TestLog::endImageSet(pTVar2);
    tcu::LogImage::~LogImage((LogImage *)colors);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_1f8);
    tcu::LogImage::~LogImage((LogImage *)&layer);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_238);
    tcu::LogImageSet::~LogImageSet((LogImageSet *)&layer_1);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::string::~string((string *)&section_1);
    if (bVar3 && bVar4) {
      layer._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&layer.m_pixels);
      std::operator<<((ostream *)&layer.m_pixels,"Image verification failed.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&layer,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      layer._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&layer.m_pixels);
      std::operator<<((ostream *)&layer.m_pixels,"Image is valid.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&layer,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&layer.m_pixels);
    this->m_allLayersOk = (bool)(this->m_allLayersOk & (!bVar3 || !bVar4));
    tcu::Surface::~Surface(&layer1);
    tcu::Surface::~Surface(&layer0);
    tcu::ScopedLogSection::~ScopedLogSection(&section);
    while( true ) {
      local_2e8._M_dataplus._M_p._0_4_ = iVar11;
      if (this->m_numLayers <= iVar11) break;
      pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&layer,"VerifyLayer",(allocator<char> *)&local_238);
      de::toString<int>((string *)&layer_1,(int *)&local_2e8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)colors,
                     "Verify layer ",(string *)&layer_1);
      tcu::ScopedLogSection::ScopedLogSection
                (&section_1,pTVar2,(string *)&layer,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)colors);
      std::__cxx11::string::~string((string *)colors);
      std::__cxx11::string::~string((string *)&layer_1);
      std::__cxx11::string::~string((string *)&layer);
      tcu::Surface::Surface
                (&layer,(this->m_resolveDimensions).m_data[0],(this->m_resolveDimensions).m_data[1])
      ;
      sampleTextureLayer(this,&layer,(int)local_2e8._M_dataplus._M_p);
      bVar3 = verifyEmptyImage(this,&layer,true);
      this->m_allLayersOk = (bool)(this->m_allLayersOk & bVar3);
      tcu::Surface::~Surface(&layer);
      tcu::ScopedLogSection::~ScopedLogSection(&section_1);
      iVar11 = (int)local_2e8._M_dataplus._M_p + 1;
    }
    goto LAB_003f707e;
  }
  layer1.m_width = iVar11 + -1;
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&layer,"VerifyLayer",(allocator<char> *)&section_1);
  de::toString<int>((string *)&layer_1,&layer1.m_width);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)colors,
                 "Verify layer ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&layer_1);
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&layer0,pTVar2,(string *)&layer,(string *)colors);
  std::__cxx11::string::~string((string *)colors);
  std::__cxx11::string::~string((string *)&layer_1);
  std::__cxx11::string::~string((string *)&layer);
  tcu::Surface::Surface
            (&layer_1,(this->m_resolveDimensions).m_data[0],(this->m_resolveDimensions).m_data[1]);
  sampleTextureLayer(this,&layer_1,layer1.m_width);
  local_390 = (uint *)(long)layer1.m_width;
  section_1.m_log = (TestLog *)0x3f8000003f800000;
  local_2e8._M_dataplus._M_p = (pointer)0x3f800000;
  local_2e8._M_string_length = 0x3f80000000000000;
  local_238._M_dataplus._M_p = (pointer)0x3f80000000000000;
  local_238._M_string_length = 0x3f80000000000000;
  local_1d8._M_dataplus._M_p = (pointer)0x0;
  local_1d8._M_string_length = 0x3f8000003f800000;
  local_1f8._M_dataplus._M_p = (pointer)0x3f8000003f800000;
  local_1f8._M_string_length = 0x3f80000000000000;
  local_218._M_dataplus._M_p = (pointer)0x3f800000;
  local_218._M_string_length = 0x3f8000003f800000;
  tcu::Vector<float,_4>::Vector(colors,(Vector<float,_4> *)&section_1);
  tcu::Vector<float,_4>::Vector(colors + 1,(Vector<float,_4> *)&local_2e8);
  tcu::Vector<float,_4>::Vector(colors + 2,(Vector<float,_4> *)&local_238);
  tcu::Vector<float,_4>::Vector(colors + 3,(Vector<float,_4> *)&local_1d8);
  tcu::Vector<float,_4>::Vector(colors + 4,(Vector<float,_4> *)&local_1f8);
  tcu::Vector<float,_4>::Vector(colors + 5,(Vector<float,_4> *)&local_218);
  layer._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pAVar1 = &layer.m_pixels;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pAVar1);
  std::operator<<((ostream *)pAVar1,"Verifying layer contents");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&layer,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pAVar1);
  logging = 200;
  puVar8 = &switchD_003f6e3b::switchdataD_007f39c8;
  switch(this->m_test) {
  case TEST_DEFAULT_LAYER:
    goto joined_r0x003f7001;
  case TEST_SINGLE_LAYER:
    if (this->m_targetLayer == (uint)local_390) goto LAB_003f702f;
    goto LAB_003f7010;
  case TEST_ALL_LAYERS:
  case TEST_INVOCATION_PER_LAYER:
    barColor = colors + (long)local_390;
    rowWidthRatio = 0.5;
    goto LAB_003f703c;
  case TEST_DIFFERENT_LAYERS:
  case TEST_MULTIPLE_LAYERS_PER_INVOCATION:
    if ((uint)local_390 == 0) goto LAB_003f7010;
    rowWidthRatio = (float)(int)(uint)local_390 / (float)this->m_numLayers;
    logging = 200;
    goto LAB_003f7037;
  case TEST_LAYER_ID:
    if ((uint)local_390 == 0) {
      layer.m_pixels.m_ptr._0_4_ = 0x3f800000;
    }
    else {
      layer.m_pixels.m_ptr._0_4_ = 0;
    }
    uVar12 = CONCAT44(-(uint)(((uint)((long)((ulong)(uint)((int)(uint)local_390 >> 0x1f) << 0x20 |
                                            (ulong)local_390 & 0xffffffff) / 2) & 0x80000001) == 1),
                      -(uint)(((uint)local_390 & 0x80000001) == 1));
    layer._0_8_ = uVar12 & DAT_007f0910 | ~uVar12 & DAT_007f36e0;
    layer.m_pixels.m_ptr._4_4_ = 0x3f800000;
    bVar3 = verifyImageSingleColoredRow(this,&layer_1,0.5,(Vec4 *)&layer,true);
    break;
  case TEST_LAYER_PROVOKING_VERTEX:
    puVar8 = local_390;
    if (this->m_provokingVertex == 0x8e4e) {
      if ((uint)local_390 == 1) goto LAB_003f702f;
      goto LAB_003f7010;
    }
    if (this->m_provokingVertex != 0x8e4d) goto switchD_003f6e3b_default;
joined_r0x003f7001:
    if ((uint)local_390 == 0) {
LAB_003f702f:
      rowWidthRatio = 0.5;
      logging = (char)puVar8;
LAB_003f7037:
      barColor = (Vec4 *)&section_1;
LAB_003f703c:
      bVar3 = verifyImageSingleColoredRow(this,&layer_1,rowWidthRatio,barColor,(bool)logging);
    }
    else {
LAB_003f7010:
      bVar3 = verifyEmptyImage(this,&layer_1,true);
    }
    break;
  default:
switchD_003f6e3b_default:
    bVar3 = false;
  }
  iVar10 = layer1.m_width;
  this->m_allLayersOk = (bool)(this->m_allLayersOk & bVar3);
  iVar11 = this->m_numLayers;
  tcu::Surface::~Surface(&layer_1);
  tcu::ScopedLogSection::~ScopedLogSection((ScopedLogSection *)&layer0);
  if (iVar10 < iVar11 + -1) {
    IVar9 = CONTINUE;
  }
  else {
LAB_003f707e:
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (this->m_allLayersOk == true) {
      IVar9 = STOP;
      tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,"Pass");
    }
    else {
      description_00 = "Detected invalid layer content";
LAB_003f70a4:
      tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_FAIL,description_00);
LAB_003f70ac:
      IVar9 = STOP;
    }
  }
  return IVar9;
}

Assistant:

LayeredRenderCase::IterateResult LayeredRenderCase::iterate (void)
{
	++m_iteration;

	if (m_iteration == 1)
	{
		if (m_test == TEST_LAYER_PROVOKING_VERTEX)
		{
			// which layer the implementation claims to render to

			gls::StateQueryUtil::StateQueryMemoryWriteGuard<glw::GLint> state;

			m_context.getRenderContext().getFunctions().getIntegerv(GL_LAYER_PROVOKING_VERTEX, &state);
			GLU_EXPECT_NO_ERROR(m_context.getRenderContext().getFunctions().getError(), "getInteger(GL_LAYER_PROVOKING_VERTEX)");

			if (!state.verifyValidity(m_testCtx))
				return STOP;

			m_testCtx.getLog() << tcu::TestLog::Message << "GL_LAYER_PROVOKING_VERTEX = " << glu::getProvokingVertexStr(state) << tcu::TestLog::EndMessage;

			if (state != GL_FIRST_VERTEX_CONVENTION &&
				state != GL_LAST_VERTEX_CONVENTION &&
				state != GL_UNDEFINED_VERTEX)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "getInteger(GL_LAYER_PROVOKING_VERTEX) returned illegal value. Got " << state << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got unexpected provoking vertex value");
				return STOP;
			}

			m_provokingVertex = (glw::GLenum)state;
		}

		// render to texture
		{
			const tcu::ScopedLogSection section(m_testCtx.getLog(), "RenderToTexture", "Render to layered texture");

			// render to layered texture with the geometry shader
			renderToTexture();
		}

		return CONTINUE;
	}
	else if (m_test == TEST_LAYER_PROVOKING_VERTEX && m_provokingVertex == GL_UNDEFINED_VERTEX)
	{
		// Verification requires information from another layers, layers not independent
		{
			const tcu::ScopedLogSection	section		(m_testCtx.getLog(), "VerifyLayers", "Verify layers 0 and 1");
			tcu::Surface				layer0		(m_resolveDimensions.x(), m_resolveDimensions.y());
			tcu::Surface				layer1		(m_resolveDimensions.x(), m_resolveDimensions.y());

			// sample layer to frame buffer
			sampleTextureLayer(layer0, 0);
			sampleTextureLayer(layer1, 1);

			m_allLayersOk &= verifyProvokingVertexLayers(layer0, layer1);
		}

		// Other layers empty
		for (int layerNdx = 2; layerNdx < m_numLayers; ++layerNdx)
		{
			const tcu::ScopedLogSection	section		(m_testCtx.getLog(), "VerifyLayer", "Verify layer " + de::toString(layerNdx));
			tcu::Surface				layer		(m_resolveDimensions.x(), m_resolveDimensions.y());

			// sample layer to frame buffer
			sampleTextureLayer(layer, layerNdx);

			// verify
			m_allLayersOk &= verifyEmptyImage(layer);
		}
	}
	else
	{
		// Layers independent

		const int					layerNdx	= m_iteration - 2;
		const tcu::ScopedLogSection	section		(m_testCtx.getLog(), "VerifyLayer", "Verify layer " + de::toString(layerNdx));
		tcu::Surface				layer		(m_resolveDimensions.x(), m_resolveDimensions.y());

		// sample layer to frame buffer
		sampleTextureLayer(layer, layerNdx);

		// verify
		m_allLayersOk &= verifyLayerContent(layer, layerNdx);

		if (layerNdx < m_numLayers-1)
			return CONTINUE;
	}

	// last iteration
	if (m_allLayersOk)
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Detected invalid layer content");

	return STOP;
}